

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O3

long __thiscall
jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::as_integer<long>
          (basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *this)

{
  uint uVar1;
  json_runtime_error<std::domain_error,_void> *this_00;
  json_runtime_error<std::runtime_error,_void> *this_01;
  string_view_type sVar2;
  string_view_type sVar3;
  type tVar4;
  error_code eVar5;
  string local_50;
  ulong local_30;
  to_integer_result<long,_wchar_t> local_28;
  
  while (uVar1 = (byte)((anon_union_16_15_54cbd7ed_for_basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_5
                         *)&((pointer)this)->
                            super_heap_string_base<unsigned_long,_std::allocator<char>_>)->
                       json_const_pointer_ & 0xf, uVar1 - 8 < 2) {
    this = (basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)
           (((anon_union_16_15_54cbd7ed_for_basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_5
              *)&((pointer)this)->super_heap_string_base<unsigned_long,_std::allocator<char>_>)->
           byte_str_).ptr_;
  }
  switch(uVar1) {
  case 1:
    local_30 = (ulong)*(byte *)((long)&(((pointer)this)->
                                       super_heap_string_base<unsigned_long,_std::allocator<char>_>)
                                       .extra_ + 2);
    break;
  case 2:
  case 3:
    local_30 = *(ulong *)&(((pointer)this)->
                          super_heap_string_base<unsigned_long,_std::allocator<char>_>).field_0x8;
    break;
  default:
    this_00 = (json_runtime_error<std::domain_error,_void> *)__cxa_allocate_exception(0x18);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Not an integer","");
    json_runtime_error<std::domain_error,_void>::json_runtime_error(this_00,&local_50);
    __cxa_throw(this_00,&json_runtime_error<std::domain_error,void>::typeinfo,
                json_runtime_error<std::domain_error,_void>::~json_runtime_error);
  case 5:
    local_30 = (ulong)*(double *)
                       &(((pointer)this)->
                        super_heap_string_base<unsigned_long,_std::allocator<char>_>).field_0x8;
    break;
  case 6:
    local_30 = (ulong)*(ushort *)
                       ((long)&(((pointer)this)->
                               super_heap_string_base<unsigned_long,_std::allocator<char>_>).extra_
                       + 2);
    break;
  case 7:
  case 0xf:
    sVar2 = as_string_view(this);
    sVar3 = as_string_view(this);
    tVar4 = detail::to_integer<long,wchar_t>(sVar2._M_str,sVar3._M_len,(long *)&local_30);
    local_28.ptr = tVar4.ptr;
    local_28.ec = tVar4.ec;
    if (local_28.ec != success) {
      this_01 = (json_runtime_error<std::runtime_error,_void> *)__cxa_allocate_exception(0x18);
      eVar5 = detail::to_integer_result<long,_wchar_t>::error_code(&local_28);
      (**(code **)(*(long *)eVar5._M_cat + 0x20))(&local_50,eVar5._M_cat,eVar5._M_value);
      json_runtime_error<std::runtime_error,_void>::json_runtime_error(this_01,&local_50);
      __cxa_throw(this_01,&json_runtime_error<std::runtime_error,void>::typeinfo,
                  json_runtime_error<std::runtime_error,_void>::~json_runtime_error);
    }
  }
  return local_30;
}

Assistant:

IntegerType as_integer() const
        {
            switch (storage_kind())
            {
                case json_storage_kind::short_str:
                case json_storage_kind::long_str:
                {
                    IntegerType val;
                    auto result = jsoncons::detail::to_integer(as_string_view().data(), as_string_view().length(), val);
                    if (!result)
                    {
                        JSONCONS_THROW(json_runtime_error<std::runtime_error>(result.error_code().message()));
                    }
                    return val;
                }
                case json_storage_kind::half_float:
                    return static_cast<IntegerType>(cast<half_storage>().value());
                case json_storage_kind::float64:
                    return static_cast<IntegerType>(cast<double_storage>().value());
                case json_storage_kind::int64:
                    return static_cast<IntegerType>(cast<int64_storage>().value());
                case json_storage_kind::uint64:
                    return static_cast<IntegerType>(cast<uint64_storage>().value());
                case json_storage_kind::boolean:
                    return static_cast<IntegerType>(cast<bool_storage>().value() ? 1 : 0);
                case json_storage_kind::json_const_reference:
                    return cast<json_const_reference_storage>().value().template as_integer<IntegerType>();
                case json_storage_kind::json_reference:
                    return cast<json_reference_storage>().value().template as_integer<IntegerType>();
                default:
                    JSONCONS_THROW(json_runtime_error<std::domain_error>("Not an integer"));
            }
        }